

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O0

AtmosSyncChannelMixer * __thiscall
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels(AtmosSyncChannelMixer *this)

{
  int iVar1;
  SilenceDataProvider *pSVar2;
  long in_RSI;
  pair<unsigned_int,_ASDCP::SilenceDataProvider_*> pVar3;
  SilenceDataProvider *local_100;
  SilenceDataProvider *local_f8;
  pair<unsigned_int,_ASDCP::SilenceDataProvider_*> local_f0;
  pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*> local_e0;
  Result_t local_d0 [104];
  mem_ptr<ASDCP::SilenceDataProvider> local_68;
  mem_ptr<ASDCP::SilenceDataProvider> I;
  ui32_t numSilenceChannels;
  undefined1 local_4c [8];
  AudioDescriptor tmpDesc;
  AtmosSyncChannelMixer *this_local;
  Result_t *result;
  
  tmpDesc.ContainerDuration._3_1_ = 0;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  PCM::AudioDescriptor::AudioDescriptor((AudioDescriptor *)local_4c);
  I.m_p._0_4_ = 0xd - *(int *)(in_RSI + 0x78);
  if ((int)I.m_p != 0) {
    pSVar2 = (SilenceDataProvider *)operator_new(0x40);
    SilenceDataProvider::SilenceDataProvider
              (pSVar2,(ui16_t)I.m_p,*(ui16_t *)(in_RSI + 0x60),*(ui32_t *)(in_RSI + 0x50),
               (Rational *)(in_RSI + 0x48));
    mem_ptr<ASDCP::SilenceDataProvider>::mem_ptr(&local_68,pSVar2);
    pSVar2 = mem_ptr<ASDCP::SilenceDataProvider>::operator->(&local_68);
    (*(pSVar2->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface[4])
              (local_d0,pSVar2,local_4c);
    Kumu::Result_t::operator=((Result_t *)this,local_d0);
    Kumu::Result_t::~Result_t(local_d0);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar1) {
      *(ui32_t *)(in_RSI + 100) = *(int *)(in_RSI + 100) + tmpDesc.ChannelCount;
      *(int *)(in_RSI + 0x78) = *(int *)(in_RSI + 0x78) + tmpDesc.AudioSamplingRate.Denominator;
      local_f8 = mem_ptr<ASDCP::SilenceDataProvider>::get(&local_68);
      pVar3 = std::make_pair<unsigned_int&,ASDCP::SilenceDataProvider*>((uint *)&I,&local_f8);
      local_f0.second = pVar3.second;
      local_f0.first = pVar3.first;
      std::pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*>::
      pair<unsigned_int,_ASDCP::SilenceDataProvider_*,_true>(&local_e0,&local_f0);
      std::
      vector<std::pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*>,_std::allocator<std::pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*>_>_>
      ::push_back((vector<std::pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*>,_std::allocator<std::pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*>_>_>
                   *)(in_RSI + 0x20),&local_e0);
      local_100 = ASDCP::mem_ptr::operator_cast_to_SilenceDataProvider_((mem_ptr *)&local_68);
      std::
      vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
      ::push_back((vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
                   *)(in_RSI + 8),(value_type *)&local_100);
      mem_ptr<ASDCP::SilenceDataProvider>::release(&local_68);
      if (*(int *)(in_RSI + 0x78) != 0xd) {
        __assert_fail("m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AtmosSyncChannel_Mixer.cpp"
                      ,0xe6,"Result_t ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()");
      }
    }
    mem_ptr<ASDCP::SilenceDataProvider>::~mem_ptr(&local_68);
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()
{
  Result_t result = RESULT_OK;
  PCM::AudioDescriptor tmpDesc;
  ui32_t numSilenceChannels = ATMOS::SYNC_CHANNEL - m_ChannelCount - 1;
  if (numSilenceChannels > 0)
  {
    mem_ptr<SilenceDataProvider> I = new SilenceDataProvider(numSilenceChannels,
                                                             m_ADesc.QuantizationBits,
                                                             m_ADesc.AudioSamplingRate.Numerator,
                                                             m_ADesc.EditRate);
    result = I->FillAudioDescriptor(tmpDesc);
    if ( ASDCP_SUCCESS(result) )
    {
      m_ADesc.BlockAlign += tmpDesc.BlockAlign;
      m_ChannelCount += tmpDesc.ChannelCount;
      m_outputs.push_back(std::make_pair(numSilenceChannels, I.get()));
      m_inputs.push_back(I);
      I.release();
      assert(m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1));
    }
  }
  return result;
}